

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QFixed flowPosition(iterator *it)

{
  QTextFrame *f;
  int iVar1;
  QTextFrameData *pQVar2;
  QTextLayout *this;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  QTextLine QVar5;
  QPointF QVar6;
  QTextLine local_38;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  f = it->cf;
  if ((f != (QTextFrame *)0x0) || (iVar1 = 0, it->cb != it->e)) {
    if (f == (QTextFrame *)0x0) {
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::currentBlock(it);
      this = QTextBlock::layout((QTextBlock *)local_28);
      iVar1 = QTextLayout::lineCount(this);
      QVar6 = QTextLayout::position(this);
      dVar4 = QVar6.yp;
      if (iVar1 != 0) {
        QVar5 = QTextLayout::lineAt(this,0);
        local_38.eng = QVar5.eng;
        local_38.index = QVar5.index;
        qVar3 = QTextLine::y(&local_38);
        dVar4 = dVar4 + qVar3;
      }
      iVar1 = (int)(dVar4 * 64.0);
    }
    else {
      pQVar2 = data(f);
      iVar1 = (pQVar2->position).y.val;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QFixed)iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QFixed flowPosition(const QTextFrame::iterator &it)
{
    if (it.atEnd())
        return 0;

    if (it.currentFrame()) {
        return data(it.currentFrame())->position.y;
    } else {
        QTextBlock block = it.currentBlock();
        QTextLayout *layout = block.layout();
        if (layout->lineCount() == 0)
            return QFixed::fromReal(layout->position().y());
        else
            return QFixed::fromReal(layout->position().y() + layout->lineAt(0).y());
    }
}